

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

void ncnn::dequantize_from_int32(Mat *src,Mat *dst,Mat *scale_data,Mat *bias_data,Option *opt)

{
  Layer *pLVar1;
  long in_RCX;
  size_t in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_R8;
  Mat weights [2];
  ParamDict pd;
  Layer *dequantize;
  Mat *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Mat *in_stack_fffffffffffffea8;
  ParamDict *in_stack_fffffffffffffeb0;
  Mat *local_138;
  Mat *local_108;
  undefined1 local_f8 [16];
  Mat local_e8 [2];
  undefined1 auStack_58 [40];
  Layer *local_30;
  undefined8 local_28;
  long local_20;
  size_t local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_30 = create_layer(in_stack_fffffffffffffe9c);
  ParamDict::ParamDict(in_stack_fffffffffffffeb0);
  ParamDict::set((ParamDict *)(auStack_58 + 0x18),0,*(int *)(local_18 + 0x2c));
  ParamDict::set((ParamDict *)(auStack_58 + 0x18),1,*(int *)(local_20 + 0x2c));
  (*local_30->_vptr_Layer[2])(local_30,auStack_58 + 0x18);
  local_108 = local_e8;
  do {
    Mat::Mat(local_108);
    local_108 = local_108 + 1;
  } while (local_108 != (Mat *)auStack_58);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
  pLVar1 = local_30;
  ModelBinFromMatArray::ModelBinFromMatArray
            ((ModelBinFromMatArray *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  (*pLVar1->_vptr_Layer[3])(pLVar1,local_f8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffe90);
  (*local_30->_vptr_Layer[4])(local_30,local_28);
  (*local_30->_vptr_Layer[7])(local_30,local_8,local_10,local_28);
  (*local_30->_vptr_Layer[5])(local_30,local_28);
  if (local_30 != (Layer *)0x0) {
    (*local_30->_vptr_Layer[1])();
  }
  local_138 = (Mat *)auStack_58;
  do {
    local_138 = local_138 + -1;
    Mat::~Mat((Mat *)0x146aa1);
  } while (local_138 != local_e8);
  ParamDict::~ParamDict((ParamDict *)in_stack_fffffffffffffe90);
  return;
}

Assistant:

void dequantize_from_int32(const Mat& src, Mat& dst, const Mat& scale_data, const Mat& bias_data, const Option& opt)
{
    Layer* dequantize = create_layer(LayerType::Dequantize);

    ParamDict pd;
    pd.set(0, scale_data.w);
    pd.set(1, bias_data.w);

    dequantize->load_param(pd);

    Mat weights[2];
    weights[0] = scale_data;
    weights[1] = bias_data;

    dequantize->load_model(ModelBinFromMatArray(weights));

    dequantize->create_pipeline(opt);

    dequantize->forward(src, dst, opt);

    dequantize->destroy_pipeline(opt);

    delete dequantize;
}